

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O3

long __thiscall
glcts::anon_unknown_0::BasicWorkGroupSizeIsConst::Run(BasicWorkGroupSizeIsConst *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  GLuint program;
  GLint location;
  void *pvVar2;
  bool *compile_error;
  ulong uVar3;
  undefined8 *puVar4;
  string *psVar5;
  GLuint i;
  ulong uVar6;
  long lVar7;
  byte bVar8;
  GLuint values [24];
  string local_88 [3];
  
  bVar8 = 0;
  local_88[0]._M_dataplus._M_p = (pointer)&local_88[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_88,
             "\nlayout(local_size_x = 2, local_size_y = 3, local_size_z = 4) in;\nlayout(std430, binding = 0) buffer Output {\n  uint g_buffer[22u + gl_WorkGroupSize.x];\n};\nshared uint g_shared[gl_WorkGroupSize.x * gl_WorkGroupSize.y * gl_WorkGroupSize.z];\nuniform uint g_uniform[gl_WorkGroupSize.z + 20u];\nvoid main() {\n  g_shared[gl_LocalInvocationIndex] = 1U;\n  groupMemoryBarrier();\n  barrier();\n  uint sum = 0u;\n  for (uint i = 0u; i < gl_WorkGroupSize.x * gl_WorkGroupSize.y * gl_WorkGroupSize.z; ++i) {\n    sum += g_shared[i];\n  }\n  sum += g_uniform[gl_LocalInvocationIndex];\n  g_buffer[gl_LocalInvocationIndex] = sum;\n}"
             ,"");
  program = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,local_88);
  this->m_program = program;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88[0]._M_dataplus._M_p != &local_88[0].field_2) {
    operator_delete(local_88[0]._M_dataplus._M_p,local_88[0].field_2._M_allocated_capacity + 1);
    program = this->m_program;
  }
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glLinkProgram(this_00,program);
  bVar1 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program,compile_error);
  lVar7 = -1;
  if (bVar1) {
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_storage_buffer);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,this->m_storage_buffer);
    glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x60,(void *)0x0,0x88e4);
    glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
    puVar4 = &DAT_01af7c00;
    psVar5 = local_88;
    for (lVar7 = 0xc; lVar7 != 0; lVar7 = lVar7 + -1) {
      psVar5->_M_dataplus = *puVar4;
      puVar4 = puVar4 + (ulong)bVar8 * -2 + 1;
      psVar5 = (string *)((long)psVar5 + ((ulong)bVar8 * -2 + 1) * 8);
    }
    location = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_uniform");
    glu::CallLogWrapper::glUniform1uiv(this_00,location,0x18,(GLuint *)local_88);
    glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
    glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer);
    pvVar2 = glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,0x60,1);
    uVar6 = 0;
    lVar7 = 0;
    do {
      uVar3 = (ulong)*(uint *)((long)pvVar2 + uVar6 * 4);
      if (uVar6 + 0x19 != uVar3) {
        anon_unknown_0::Output
                  ("Data at index %u is %u should be %u.\n",uVar6 & 0xffffffff,uVar3,
                   (ulong)((int)uVar6 + 0x19));
        lVar7 = -1;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != 0x18);
    glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
  }
  return lVar7;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_cs =
			NL "layout(local_size_x = 2, local_size_y = 3, local_size_z = 4) in;" NL
			   "layout(std430, binding = 0) buffer Output {" NL "  uint g_buffer[22u + gl_WorkGroupSize.x];" NL "};" NL
			   "shared uint g_shared[gl_WorkGroupSize.x * gl_WorkGroupSize.y * gl_WorkGroupSize.z];" NL
			   "uniform uint g_uniform[gl_WorkGroupSize.z + 20u];" NL "void main() {" NL
			   "  g_shared[gl_LocalInvocationIndex] = 1U;" NL "  groupMemoryBarrier();" NL "  barrier();" NL
			   "  uint sum = 0u;" NL
			   "  for (uint i = 0u; i < gl_WorkGroupSize.x * gl_WorkGroupSize.y * gl_WorkGroupSize.z; ++i) {" NL
			   "    sum += g_shared[i];" NL "  }" NL "  sum += g_uniform[gl_LocalInvocationIndex];" NL
			   "  g_buffer[gl_LocalInvocationIndex] = sum;" NL "}";
		m_program = CreateComputeProgram(glsl_cs);
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		glGenBuffers(1, &m_storage_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, 24 * sizeof(GLuint), NULL, GL_STATIC_DRAW);

		glUseProgram(m_program);
		GLuint values[24] = { 1u,  2u,  3u,  4u,  5u,  6u,  7u,  8u,  9u,  10u, 11u, 12u,
							  13u, 14u, 15u, 16u, 17u, 18u, 19u, 20u, 21u, 22u, 23u, 24u };
		glUniform1uiv(glGetUniformLocation(m_program, "g_uniform"), 24, values);
		glDispatchCompute(1, 1, 1);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		long	error = NO_ERROR;
		GLuint* data;
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer);
		data =
			static_cast<GLuint*>(glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(GLuint) * 24, GL_MAP_READ_BIT));
		for (GLuint i = 0; i < 24; ++i)
		{
			if (data[i] != (i + 25))
			{
				Output("Data at index %u is %u should be %u.\n", i, data[i], i + 25);
				error = ERROR;
			}
		}
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);
		return error;
	}